

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O3

void crnlib::Hc4_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  CLzRef CVar1;
  CLzRef CVar2;
  byte *pbVar3;
  uint uVar4;
  UInt32 UVar5;
  uint uVar6;
  uint uVar7;
  
  do {
    if (p->lenLimit < 4) {
      MatchFinder_MovePos(p);
    }
    else {
      pbVar3 = p->buffer;
      uVar4 = (uint)pbVar3[1] ^ p->crc[*pbVar3];
      uVar7 = (uint)pbVar3[2] << 8 ^ uVar4;
      uVar6 = ((p->crc[pbVar3[3]] << 5 ^ uVar7) & p->hashMask) + 0x10400;
      CVar1 = p->hash[uVar6];
      CVar2 = p->pos;
      p->hash[uVar6] = CVar2;
      p->hash[(ulong)(uVar7 & 0xffff) + 0x400] = CVar2;
      p->hash[uVar4 & 0x3ff] = CVar2;
      p->son[p->cyclicBufferPos] = CVar1;
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar5 = p->pos + 1;
      p->pos = UVar5;
      if (UVar5 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

static void Hc4_MatchFinder_Skip(CMatchFinder* p, UInt32 num) {
  do {
    UInt32 hash2Value, hash3Value;
    SKIP_HEADER(4)
    HASH4_CALC;
    curMatch = p->hash[kFix4HashSize + hashValue];
    p->hash[hash2Value] =
        p->hash[kFix3HashSize + hash3Value] =
            p->hash[kFix4HashSize + hashValue] = p->pos;
    p->son[p->cyclicBufferPos] = curMatch;
    MOVE_POS
  } while (--num != 0);
}